

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

bool __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::
IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
::operator==(IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
             *this,Iterator *other)

{
  bool bVar1;
  Fatal local_198;
  
  if (this->parent == other->parent) {
    if (this->usingFixed != other->usingFixed) {
      Fatal::Fatal(&local_198);
      Fatal::operator<<(&local_198,
                        (char (*) [50])"SmallSet does not support changes while iterating");
      Fatal::~Fatal(&local_198);
    }
    if (this->usingFixed == false) {
      bVar1 = (this->flexibleIterator)._M_node == (other->flexibleIterator)._M_node;
    }
    else {
      bVar1 = this->fixedIndex == other->fixedIndex;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const Iterator& other) const {
      if (parent != other.parent) {
        return false;
      }
      // std::set allows changes while iterating. For us here, though, it would
      // be nontrivial to support that given we have two iterators that we
      // generalize over (switching "in the middle" would not be easy or fast),
      // so error on that.
      if (usingFixed != other.usingFixed) {
        Fatal() << "SmallSet does not support changes while iterating";
      }
      if (usingFixed) {
        return fixedIndex == other.fixedIndex;
      } else {
        return flexibleIterator == other.flexibleIterator;
      }
    }